

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O2

SinglyNodeWithRand * __thiscall
si9ma::SinglyLinkedList::get_prev(SinglyLinkedList *this,SinglyNodeWithRand *node)

{
  SinglyNodeWithRand *pSVar1;
  undefined8 *puVar2;
  SinglyNodeWithRand *pSVar3;
  char *pcVar4;
  
  if (this->size == 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "linked list is empty";
LAB_00107160:
    *puVar2 = pcVar4;
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  if (this->head == node) {
    pSVar3 = (SinglyNodeWithRand *)0x0;
  }
  else {
    pSVar1 = this->head;
    do {
      pSVar3 = pSVar1;
      if (pSVar3->next == node) break;
      pSVar1 = pSVar3->next;
    } while (pSVar3 != this->tail);
    if (pSVar3 == this->tail) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar4 = "can not found prev";
      goto LAB_00107160;
    }
  }
  return pSVar3;
}

Assistant:

SinglyNodeWithRand* SinglyLinkedList::get_prev(SinglyNodeWithRand *node) {
        if (size == 0)
            throw "linked list is empty";

        if (node == head)
            return nullptr;

        SinglyNodeWithRand *prev = head;
        while (prev->next != node && prev != tail)
            prev = prev->next;

        if (prev == tail)
            throw "can not found prev";

        return prev;
    }